

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_16bit_3chan_interleave(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  void *pvVar4;
  int iVar5;
  int x;
  ulong uVar6;
  uint8_t *puVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  void *pvVar11;
  void *pvVar12;
  uint16_t *out;
  uint8_t *puVar13;
  
  pvVar4 = decode->unpacked_buffer;
  peVar3 = decode->channels;
  uVar1 = peVar3->width;
  iVar5 = (decode->chunk).height;
  iVar2 = peVar3->user_line_stride;
  puVar7 = (peVar3->field_12).decode_to_ptr;
  lVar8 = (long)(int)(uVar1 * 6);
  iVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  pvVar11 = (void *)((long)pvVar4 + (long)(int)uVar1 * 4);
  pvVar12 = (void *)((long)pvVar4 + (long)(int)uVar1 * 2);
  for (; iVar9 != iVar5; iVar9 = iVar9 + 1) {
    puVar13 = puVar7;
    for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
      *(undefined2 *)puVar13 = *(undefined2 *)((long)pvVar4 + uVar6 * 2);
      *(undefined2 *)(puVar13 + 2) = *(undefined2 *)((long)pvVar12 + uVar6 * 2);
      *(undefined2 *)(puVar13 + 4) = *(undefined2 *)((long)pvVar11 + uVar6 * 2);
      puVar13 = puVar13 + 6;
    }
    pvVar4 = (void *)((long)pvVar4 + lVar8);
    puVar7 = puVar7 + iVar2;
    pvVar11 = (void *)((long)pvVar11 + lVar8);
    pvVar12 = (void *)((long)pvVar12 + lVar8);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        uint16_t* out = (uint16_t*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = one_to_native16 (in0[x]);
            out[1] = one_to_native16 (in1[x]);
            out[2] = one_to_native16 (in2[x]);
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}